

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_input(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  anon_struct_64_2_7cec4369_for_recvbuf *buf;
  size_t *psVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  size_t sVar10;
  uint uVar11;
  int iVar12;
  ushort uVar14;
  code *cb;
  ulong uVar15;
  ulong uVar16;
  uint8_t *puVar17;
  long lVar18;
  bool bVar19;
  size_t decrypted_length;
  st_ptls_record_t local_68;
  ptls_buffer_t *local_48;
  ulong *local_40;
  size_t local_38;
  int iVar13;
  
  uVar4 = local_68._0_8_;
  buf = &tls->recvbuf;
  puVar3 = (tls->recvbuf).rec.base;
  if ((puVar3 == (uint8_t *)0x0) && ((uint8_t *)0x4 < (uint8_t *)*inlen)) {
    local_68.type = *input;
    uVar5 = local_68._0_8_;
    local_68._4_4_ = SUB84(uVar4,4);
    local_68._0_2_ = SUB82(uVar5,0);
    local_68.version = *(ushort *)((long)input + 1) << 8 | *(ushort *)((long)input + 1) >> 8;
    uVar14 = *(ushort *)((long)input + 3) << 8 | *(ushort *)((long)input + 3) >> 8;
    local_68.length = (size_t)uVar14;
    uVar15 = (ulong)(*input == '\x17') << 8 | 0x4000;
    iVar6 = 0x32;
    if (local_68.length <= uVar15) {
      iVar6 = 0;
    }
    if ((uint)uVar14 <= (uint)uVar15) {
      puVar17 = (uint8_t *)(local_68.length + 5);
      if ((uint8_t *)*inlen < puVar17) goto LAB_00111789;
      local_68.fragment = (uint8_t *)((long)input + 5);
      iVar6 = 0;
      goto LAB_00111951;
    }
  }
  else {
LAB_00111789:
    sVar10 = *inlen;
    local_68.type = '\0';
    local_68._1_1_ = 0;
    local_68.version = 0;
    local_68._4_4_ = 0;
    local_68.length = 0;
    local_68.fragment = (uint8_t *)0x0;
    if (puVar3 == (uint8_t *)0x0) {
      (tls->recvbuf).rec.base = "";
      (tls->recvbuf).rec.capacity = 0;
      (tls->recvbuf).rec.off = 0;
      (tls->recvbuf).rec.is_allocated = 0;
      iVar6 = ptls_buffer_reserve(&buf->rec,5);
      if (iVar6 != 0) goto LAB_00111954;
    }
    uVar4 = local_68._0_8_;
    uVar15 = (tls->recvbuf).rec.off;
    sVar9 = sVar10;
    puVar17 = (uint8_t *)input;
    while (uVar15 < 5) {
      if (sVar9 == 0) {
        iVar6 = 0x202;
        goto LAB_00111954;
      }
      uVar2 = *puVar17;
      puVar17 = puVar17 + 1;
      puVar3 = (tls->recvbuf).rec.base;
      (tls->recvbuf).rec.off = uVar15 + 1;
      puVar3[uVar15] = uVar2;
      sVar9 = sVar9 - 1;
      uVar15 = (tls->recvbuf).rec.off;
    }
    puVar3 = (buf->rec).base;
    local_68.type = *puVar3;
    uVar5 = local_68._0_8_;
    local_68._4_4_ = SUB84(uVar4,4);
    local_68._0_2_ = SUB82(uVar5,0);
    local_68.version = *(ushort *)(puVar3 + 1) << 8 | *(ushort *)(puVar3 + 1) >> 8;
    uVar14 = *(ushort *)(puVar3 + 3) << 8 | *(ushort *)(puVar3 + 3) >> 8;
    local_68.length = (size_t)uVar14;
    uVar16 = (ulong)(*puVar3 == '\x17') << 8 | 0x4000;
    iVar6 = 0x32;
    if (local_68.length <= uVar16) {
      iVar6 = 0;
    }
    if ((uint)uVar14 <= (uint)uVar16) {
      lVar18 = (long)input + sVar10;
      sVar10 = local_68.length + 5;
      uVar15 = sVar10 - uVar15;
      if (uVar15 != 0) {
        local_48 = decryptbuf;
        local_40 = inlen;
        iVar6 = ptls_buffer_reserve(&buf->rec,uVar15);
        decryptbuf = local_48;
        if (iVar6 != 0) goto LAB_00111954;
        uVar16 = lVar18 - (long)puVar17;
        if (uVar15 < uVar16) {
          uVar16 = uVar15;
        }
        inlen = local_40;
        if (uVar16 != 0) {
          memcpy((tls->recvbuf).rec.base + (tls->recvbuf).rec.off,puVar17,uVar16);
          psVar1 = &(tls->recvbuf).rec.off;
          *psVar1 = *psVar1 + uVar16;
          puVar17 = puVar17 + uVar16;
          decryptbuf = local_48;
          inlen = local_40;
        }
      }
      iVar6 = 0x202;
      if ((tls->recvbuf).rec.off == sVar10) {
        local_68.fragment = (buf->rec).base + 5;
        iVar6 = 0;
      }
      puVar17 = puVar17 + (*inlen - lVar18);
LAB_00111951:
      *inlen = (size_t)puVar17;
    }
  }
LAB_00111954:
  puVar3 = local_68.fragment;
  sVar10 = local_68.length;
  if (iVar6 != 0) {
    return iVar6;
  }
  if (local_68.fragment == (uint8_t *)0x0) {
    __assert_fail("rec.fragment != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                  ,0x120e,
                  "int handle_input(ptls_t *, ptls_message_emitter_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  if (local_68.type == '\x14') {
    if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
      return 0x28;
    }
    if (local_68.length != 1) {
      return 0x2f;
    }
    uVar8 = 0x202;
    if (*local_68.fragment != '\x01') {
      return 0x2f;
    }
    goto LAB_00111b50;
  }
  if ((local_68.type == '\x15') ||
     ((tls->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0)) {
    if ((local_68.type != '\x17') ||
       (((tls->field_0x160 & 1) == 0 ||
        ((tls->field_18).server.early_data_skipped_bytes == 0xffffffff)))) goto LAB_00111a4c;
  }
  else {
    iVar13 = 1;
    iVar12 = 1;
    iVar7 = 0x28;
    iVar6 = iVar12;
    if ((local_68.type == '\x17') &&
       (iVar7 = ptls_buffer_reserve(decryptbuf,local_68.length + 5), iVar6 = iVar13, iVar7 == 0)) {
      iVar7 = aead_decrypt(&(tls->traffic_protection).dec,decryptbuf->base + decryptbuf->off,
                           &local_38,puVar3,sVar10);
      if (iVar7 == 0) {
        local_68.fragment = decryptbuf->base + decryptbuf->off;
        bVar19 = local_38 == 0;
        if (bVar19) {
LAB_00111c02:
          iVar7 = 10;
          iVar6 = iVar12;
          local_68.length = local_38;
        }
        else {
          if (local_68.fragment[local_38 - 1] == '\0') {
            sVar10 = local_38;
            do {
              bVar19 = sVar10 == 1;
              if (bVar19) {
                local_38 = 0;
                goto LAB_00111c02;
              }
              local_38 = sVar10 - 1;
              lVar18 = sVar10 + (decryptbuf->off - 2);
              sVar10 = local_38;
            } while (decryptbuf->base[lVar18] == '\0');
          }
          iVar7 = 10;
          iVar6 = iVar12;
          local_68.length = local_38;
          if (!bVar19) {
            local_68.length = local_38 - 1;
            iVar7 = (int)CONCAT71((int7)(local_68.length >> 8),local_68.fragment[local_38 - 1]);
            local_68.type = local_68.fragment[local_38 - 1];
            iVar6 = 0;
          }
        }
      }
      else if (((tls->field_0x160 & 1) != 0) &&
              ((tls->field_18).server.early_data_skipped_bytes != 0xffffffff)) {
        iVar6 = 3;
      }
    }
    if (iVar6 == 0) {
LAB_00111a4c:
      if (local_68.type == '\x16' || (tls->recvbuf).mess.base != (uint8_t *)0x0) {
        cb = handle_server_handshake_message;
        if ((tls->field_0x160 & 1) == 0) {
          cb = handle_client_handshake_message;
        }
        uVar8 = handle_handshake_record(tls,cb,emitter,&local_68,properties);
      }
      else if (local_68.type == '\x15') {
        uVar8 = 0x32;
        if (local_68.length == 2) {
          uVar8 = local_68.fragment[1] | 0x100;
        }
      }
      else {
        uVar8 = 10;
        if (local_68.type == '\x17') {
          if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
            if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
              uVar8 = 0;
              if ((tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0) {
                decryptbuf->off = decryptbuf->off + local_68.length;
                uVar8 = 0;
              }
            }
          }
          else {
            decryptbuf->off = decryptbuf->off + local_68.length;
            uVar8 = 0;
          }
        }
      }
      goto LAB_00111b50;
    }
    if (iVar6 != 3) {
      return iVar7;
    }
  }
  uVar11 = (tls->field_18).server.early_data_skipped_bytes + (int)local_68.length;
  (tls->field_18).server.early_data_skipped_bytes = uVar11;
  uVar8 = 0x202;
  if (0x10000 < uVar11) {
    return 0x28;
  }
LAB_00111b50:
  ptls_buffer__release_memory(&buf->rec);
  (tls->recvbuf).rec.off = 0;
  *(undefined8 *)&(tls->recvbuf).rec.is_allocated = 0;
  (buf->rec).base = (uint8_t *)0x0;
  (tls->recvbuf).rec.capacity = 0;
  return uVar8;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        size_t decrypted_length;
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &decrypted_length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX)
                goto ServerSkipEarlyData;
            return ret;
        }
        rec.length = decrypted_length;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX) {
        goto ServerSkipEarlyData;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
        ret = handle_handshake_record(tls, tls->is_server ? handle_server_handshake_message : handle_client_handshake_message,
                                      emitter, &rec, properties);
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;

ServerSkipEarlyData:
    tls->server.early_data_skipped_bytes += (uint32_t)rec.length;
    if (tls->server.early_data_skipped_bytes > PTLS_MAX_EARLY_DATA_SKIP_SIZE)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    ret = PTLS_ERROR_IN_PROGRESS;
    goto NextRecord;
}